

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

TypeID NULLCTypeInfo::TypeArgumentType(int argument,int *typeID)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternMemberInfo *pEVar3;
  ExternMemberInfo *memberList;
  ExternTypeInfo *type;
  int *typeID_local;
  int argument_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar1->subCat == CAT_FUNCTION) {
      if ((uint)argument < (pEVar1->field_8).arrSize) {
        pEVar3 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           ((FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210),0);
        typeID_local._4_4_ = getTypeID(pEVar3[(pEVar1->field_11).subType + argument + 1].type);
      }
      else {
        pcVar2 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName)
        ;
        nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)"
                        ,pcVar2,(ulong)(pEVar1->field_8).arrSize);
        typeID_local._4_4_ = getTypeID(0);
      }
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("typeid::argumentType received type (%s) that is not a function",pcVar2);
      typeID_local._4_4_ = getTypeID(0);
    }
    return (TypeID)typeID_local._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xf8,"TypeID NULLCTypeInfo::TypeArgumentType(int, int *)");
}

Assistant:

TypeID TypeArgumentType(int argument, int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::argumentType received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		if((unsigned int)argument >= type.memberCount)
		{
			nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)", &linker->exSymbols[type.offsetToName], type.memberCount);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[type.memberOffset + argument + 1].type);
	}